

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O0

bool MaybeCopyCipherContext(bool copy,UniquePtr<EVP_CIPHER_CTX> *ctx)

{
  bool bVar1;
  int iVar2;
  EVP_CIPHER_CTX *pEVar3;
  EVP_CIPHER_CTX *in;
  unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> local_20;
  UniquePtr<EVP_CIPHER_CTX> ctx2;
  UniquePtr<EVP_CIPHER_CTX> *ctx_local;
  bool copy_local;
  
  if (!copy) {
    return true;
  }
  ctx2._M_t.super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<evp_cipher_ctx_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<evp_cipher_ctx_st,_bssl::internal::Deleter,_true,_true>)ctx;
  pEVar3 = EVP_CIPHER_CTX_new();
  std::unique_ptr<evp_cipher_ctx_st,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<evp_cipher_ctx_st,bssl::internal::Deleter> *)&local_20,(pointer)pEVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20);
  if (bVar1) {
    pEVar3 = (EVP_CIPHER_CTX *)
             std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get(&local_20);
    in = (EVP_CIPHER_CTX *)
         std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                   ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                    ctx2._M_t.super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>._M_t
                    .super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl);
    iVar2 = EVP_CIPHER_CTX_copy(pEVar3,in);
    if (iVar2 != 0) {
      std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::operator=
                ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                 ctx2._M_t.super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl,&local_20);
      ctx_local._7_1_ = true;
      goto LAB_002ead8e;
    }
  }
  ctx_local._7_1_ = false;
LAB_002ead8e:
  std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  return ctx_local._7_1_;
}

Assistant:

static bool MaybeCopyCipherContext(bool copy,
                                   bssl::UniquePtr<EVP_CIPHER_CTX> *ctx) {
  if (!copy) {
    return true;
  }
  bssl::UniquePtr<EVP_CIPHER_CTX> ctx2(EVP_CIPHER_CTX_new());
  if (!ctx2 || !EVP_CIPHER_CTX_copy(ctx2.get(), ctx->get())) {
    return false;
  }
  *ctx = std::move(ctx2);
  return true;
}